

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::SqueezeLayerParams::SerializeWithCachedSizes
          (SqueezeLayerParams *this,CodedOutputStream *output)

{
  bool bVar1;
  int iVar2;
  int64 value;
  int local_20;
  int n;
  int i;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  SqueezeLayerParams *this_local;
  
  iVar2 = axes_size(this);
  if (0 < iVar2) {
    google::protobuf::internal::WireFormatLite::WriteTag(1,WIRETYPE_LENGTH_DELIMITED,output);
    google::protobuf::io::CodedOutputStream::WriteVarint32(output,this->_axes_cached_byte_size_);
  }
  local_20 = 0;
  iVar2 = axes_size(this);
  for (; local_20 < iVar2; local_20 = local_20 + 1) {
    value = axes(this,local_20);
    google::protobuf::internal::WireFormatLite::WriteInt64NoTag(value,output);
  }
  bVar1 = squeezeall(this);
  if (bVar1) {
    bVar1 = squeezeall(this);
    google::protobuf::internal::WireFormatLite::WriteBool(2,bVar1,output);
  }
  return;
}

Assistant:

void SqueezeLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.SqueezeLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated int64 axes = 1;
  if (this->axes_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(1, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_axes_cached_byte_size_);
  }
  for (int i = 0, n = this->axes_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64NoTag(
      this->axes(i), output);
  }

  // bool squeezeAll = 2;
  if (this->squeezeall() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(2, this->squeezeall(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.SqueezeLayerParams)
}